

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

pool_ptr<soul::heart::ProcessorInstance> __thiscall
soul::HEARTGenerator::getOrAddProcessorInstance
          (HEARTGenerator *this,pool_ptr<soul::AST::ProcessorInstance> *instance)

{
  SharedEndpoint *pSVar1;
  pointer ppVar2;
  _Storage<unsigned_int,_true> _Var3;
  __type_conflict1 _Var4;
  ProcessorInstance *pPVar5;
  UnqualifiedName *pUVar6;
  Graph *pGVar7;
  ProcessorBase *pPVar8;
  ProcessorInstance *pPVar9;
  optional<unsigned_int> oVar10;
  Expression *pEVar11;
  Constant *pCVar12;
  pool_ptr<soul::AST::ProcessorInstance> *in_RDX;
  SharedEndpoint *pSVar13;
  pointer ppVar14;
  pool_ptr<soul::AST::Constant> c;
  string instanceName;
  pool_ptr<soul::AST::Expression> local_c8;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if (in_RDX->object == (ProcessorInstance *)0x0) {
    (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)0x0;
  }
  else {
    pPVar5 = pool_ptr<soul::AST::ProcessorInstance>::operator->(in_RDX);
    pUVar6 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pPVar5->instanceName);
    AST::UnqualifiedName::toString_abi_cxx11_(&instanceName,pUVar6);
    pSVar13 = instance[3].object[1].implicitInstanceSource.object;
    pSVar1 = (SharedEndpoint *)instance[3].object[2].super_ASTObject._vptr_ASTObject;
    do {
      if (pSVar13 == pSVar1) {
        pGVar7 = pool_ptr<const_soul::AST::Graph>::operator->
                           ((pool_ptr<const_soul::AST::Graph> *)(instance + 1));
        ppVar14 = (pGVar7->processorInstances).
                  super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar2 = (pGVar7->processorInstances).
                 super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pPVar9 = (ProcessorInstance *)0x0;
        goto LAB_0026fa42;
      }
      pPVar9 = (ProcessorInstance *)(pSVar13->endpoint).object;
      _Var4 = std::operator==(&instanceName,&pPVar9->instanceName);
      pSVar13 = pSVar13 + 1;
    } while (!_Var4);
LAB_0026fc2b:
    (this->super_ASTVisitor)._vptr_ASTVisitor = (_func_int **)pPVar9;
    std::__cxx11::string::~string((string *)&instanceName);
  }
  return (pool_ptr<soul::heart::ProcessorInstance>)(ProcessorInstance *)this;
LAB_0026fa42:
  if (ppVar14 == ppVar2) goto LAB_0026fc2b;
  pUVar6 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&ppVar14->object->instanceName);
  AST::UnqualifiedName::toString_abi_cxx11_((string *)&c,pUVar6);
  _Var4 = std::operator==((string *)&c,&instanceName);
  std::__cxx11::string::~string((string *)&c);
  if (_Var4) {
    pGVar7 = pool_ptr<const_soul::AST::Graph>::operator->
                       ((pool_ptr<const_soul::AST::Graph> *)(instance + 1));
    pPVar8 = AST::Scope::findSingleMatchingProcessor
                       (&(pGVar7->super_ProcessorBase).super_ModuleBase.super_Scope,ppVar14->object)
    ;
    c.object = (Constant *)0x0;
    pPVar9 = Module::allocate<soul::heart::ProcessorInstance,soul::CodeLocation>
                       ((Module *)instance[3].object,(CodeLocation *)&c);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr((RefCountedPtr<soul::SourceCodeText> *)&c);
    std::__cxx11::string::_M_assign((string *)&pPVar9->instanceName);
    (*(pPVar8->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xd])(&c,pPVar8);
    IdentifierPath::toString_abi_cxx11_(&local_c0,(IdentifierPath *)&c);
    std::__cxx11::string::operator=((string *)&pPVar9->sourceName,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear
              ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&c);
    local_c8.object = (ppVar14->object->arraySize).object;
    oVar10 = getProcessorArraySize(&local_c8);
    _Var3._M_value = 1;
    if (((ulong)oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      _Var3._M_value =
           oVar10.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
    }
    pPVar9->arraySize = (uint32_t)_Var3;
    pPVar5 = ppVar14->object;
    if ((pPVar5->clockMultiplierRatio).object != (Expression *)0x0) {
      pEVar11 = pool_ptr<soul::AST::Expression>::operator->(&pPVar5->clockMultiplierRatio);
      (*(pEVar11->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&c,pEVar11);
      if (c.object == (Constant *)0x0) {
        pEVar11 = pool_ptr<soul::AST::Expression>::operator->
                            (&ppVar14->object->clockMultiplierRatio);
        Errors::ratioMustBeInteger<>();
        AST::Context::throwError
                  (&(pEVar11->super_Statement).super_ASTObject.context,&local_68,false);
      }
      pEVar11 = pool_ptr<soul::AST::Expression>::operator->(&ppVar14->object->clockMultiplierRatio);
      pCVar12 = pool_ptr<soul::AST::Constant>::operator->(&c);
      heart::ClockMultiplier::setMultiplier<soul::AST::Context&>
                (&pPVar9->clockMultiplier,&(pEVar11->super_Statement).super_ASTObject.context,
                 &pCVar12->value);
      pPVar5 = ppVar14->object;
    }
    if ((pPVar5->clockDividerRatio).object != (Expression *)0x0) {
      pEVar11 = pool_ptr<soul::AST::Expression>::operator->(&pPVar5->clockDividerRatio);
      (*(pEVar11->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&c,pEVar11);
      if (c.object == (Constant *)0x0) {
        pEVar11 = pool_ptr<soul::AST::Expression>::operator->(&ppVar14->object->clockDividerRatio);
        Errors::ratioMustBeInteger<>();
        AST::Context::throwError
                  (&(pEVar11->super_Statement).super_ASTObject.context,&local_a0,false);
      }
      pEVar11 = pool_ptr<soul::AST::Expression>::operator->(&ppVar14->object->clockDividerRatio);
      pCVar12 = pool_ptr<soul::AST::Constant>::operator->(&c);
      heart::ClockMultiplier::setDivider<soul::AST::Context&>
                (&pPVar9->clockMultiplier,&(pEVar11->super_Statement).super_ASTObject.context,
                 &pCVar12->value);
      pPVar5 = ppVar14->object;
    }
    if ((pPVar5->specialisationArgs).object != (Expression *)0x0) {
      throwInternalCompilerError
                ("i->specialisationArgs == nullptr","getOrAddProcessorInstance",0x14f);
    }
    c.object = (Constant *)pPVar9;
    std::
    vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
    ::emplace_back<soul::pool_ref<soul::heart::ProcessorInstance>>
              ((vector<soul::pool_ref<soul::heart::ProcessorInstance>,std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>>>
                *)&instance[3].object[1].implicitInstanceSource,
               (pool_ref<soul::heart::ProcessorInstance> *)&c);
    goto LAB_0026fc2b;
  }
  ppVar14 = ppVar14 + 1;
  goto LAB_0026fa42;
}

Assistant:

pool_ptr<heart::ProcessorInstance> getOrAddProcessorInstance (pool_ptr<AST::ProcessorInstance> instance)
    {
        if (instance == nullptr)
            return {};

        auto instanceName = instance->instanceName->toString();

        for (auto i : module.processorInstances)
            if (instanceName == i->instanceName)
                return i;

        for (auto& i : sourceGraph->processorInstances)
        {
            if (i->instanceName->toString() == instanceName)
            {
                auto& targetProcessor = sourceGraph->findSingleMatchingProcessor (i);

                auto& p = module.allocate<heart::ProcessorInstance> (CodeLocation{});
                p.instanceName = instanceName;
                p.sourceName = targetProcessor.getFullyQualifiedPath().toString();
                p.arraySize = getProcessorArraySize (i->arraySize).value_or (1);

                if (i->clockMultiplierRatio != nullptr)
                {
                    if (auto c = i->clockMultiplierRatio->getAsConstant())
                        p.clockMultiplier.setMultiplier (i->clockMultiplierRatio->context, c->value);
                    else
                        i->clockMultiplierRatio->context.throwError (Errors::ratioMustBeInteger());
                }

                if (i->clockDividerRatio != nullptr)
                {
                    if (auto c = i->clockDividerRatio->getAsConstant())
                        p.clockMultiplier.setDivider (i->clockDividerRatio->context, c->value);
                    else
                        i->clockDividerRatio->context.throwError (Errors::ratioMustBeInteger());
                }

                SOUL_ASSERT (i->specialisationArgs == nullptr);

                module.processorInstances.push_back (p);
                return p;
            }
        }

        return {};
    }